

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.c
# Opt level: O0

double rhs_2nd_equation(double x,double t,Gas_parameters *parameters)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Gas_parameters *parameters_local;
  double t_local;
  double x_local;
  
  dVar3 = u_t(x,t);
  dVar4 = u_exact(x,t);
  dVar5 = u_x(x,t);
  dVar1 = parameters->p_ro;
  dVar6 = g_x(x,t);
  dVar2 = parameters->viscosity;
  dVar7 = g_exact(x,t);
  dVar7 = exp_1(dVar7);
  dVar8 = u_xx(x,t);
  return -(dVar2 * dVar7) * dVar8 + dVar1 * dVar6 + dVar4 * dVar5 + dVar3;
}

Assistant:

double rhs_2nd_equation (double x, double t, Gas_parameters const * parameters) {
  return u_t (x, t) + 
          u_exact (x, t) * u_x (x, t) + 
          parameters->p_ro * g_x (x, t) -
          parameters->viscosity * exp_1 (g_exact (x, t)) * u_xx (x, t);
}